

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O1

executor * __thiscall
spdlog::logger::
log_<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>>
          (executor *__return_storage_ptr__,logger *this,source_loc loc,level_enum lvl,
          string_view_t fmt,
          dump_info<__gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>_>
          *args)

{
  int iVar1;
  string_view_t a_logger_name;
  string_view_t msg;
  bool traceback_enabled;
  basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args_00;
  log_msg log_msg;
  log_msg local_1c8;
  buffer<char> local_158;
  char local_138 [264];
  
  iVar1 = (this->level_).super___atomic_base<int>._M_i;
  traceback_enabled = details::backtracer::enabled(&this->tracer_);
  if ((int)lvl < iVar1 && !traceback_enabled) {
    details::executor::executor(__return_storage_ptr__);
  }
  else {
    local_158.ptr_ = local_138;
    local_158.size_ = 0;
    local_158._vptr_buffer = (_func_int **)&PTR_grow_001593b0;
    local_158.capacity_ = 0xfa;
    local_1c8.logger_name.size_ =
         (size_t)::fmt::v8::detail::value<fmt::v8::basic_format_context<fmt::v8::appender,char>>::
                 format_custom_arg<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,fmt::v8::formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>,char,void>>
    ;
    args_00.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)&local_1c8;
    args_00.desc_ = 0xf;
    local_1c8.logger_name.data_ = (char *)args;
    ::fmt::v8::detail::vformat_to<char>(&local_158,fmt,args_00,(locale_ref)0x0);
    a_logger_name.data_ = (this->name_)._M_dataplus._M_p;
    a_logger_name.size_ = (this->name_)._M_string_length;
    msg.size_ = local_158.size_;
    msg.data_ = local_158.ptr_;
    details::log_msg::log_msg(&local_1c8,loc,a_logger_name,lvl,msg);
    log_it_(__return_storage_ptr__,this,&local_1c8,iVar1 <= (int)lvl,traceback_enabled);
    if (local_158.ptr_ != local_138) {
      operator_delete(local_158.ptr_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

SPDLOG_EXECUTOR_T log_(source_loc loc, level::level_enum lvl, string_view_t fmt, Args &&...args)
    {
        bool log_enabled = should_log(lvl);
        bool traceback_enabled = tracer_.enabled();
        if (!log_enabled && !traceback_enabled)
        {
            return SPDLOG_EXECUTOR_T{};
        }
        SPDLOG_TRY
        {
            memory_buf_t buf;
            fmt::detail::vformat_to(buf, fmt, fmt::make_format_args(args...));
            details::log_msg log_msg(loc, name_, lvl, string_view_t(buf.data(), buf.size()));
            return log_it_(log_msg, log_enabled, traceback_enabled);
        }